

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_iterator.hpp
# Opt level: O1

bool __thiscall
burst::
merge_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<int_*>_*,_std::vector<boost::iterator_range<int_*>,_std::allocator<boost::iterator_range<int_*>_>_>_>,_std::less<void>_>
::equal(merge_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<int_*>_*,_std::vector<boost::iterator_range<int_*>,_std::allocator<boost::iterator_range<int_*>_>_>_>,_std::less<void>_>
        *this,merge_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<int_*>_*,_std::vector<boost::iterator_range<int_*>,_std::allocator<boost::iterator_range<int_*>_>_>_>,_std::less<void>_>
              *that)

{
  iterator_range<int_*> *piVar1;
  iterator_range<int_*> *piVar2;
  int *piVar3;
  int iVar4;
  int *piVar5;
  size_t __n;
  int *__s2;
  int *__s1;
  iterator_range<int_*> *piVar6;
  int **ppiVar7;
  bool bVar8;
  
  piVar1 = (this->m_begin)._M_current;
  piVar6 = (that->m_begin)._M_current;
  if (piVar1 != piVar6) {
    __assert_fail("this->m_begin == that.m_begin",
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/merge_iterator.hpp"
                  ,0x94,
                  "bool burst::merge_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<int *> *, std::vector<boost::iterator_range<int *>>>>::equal(const merge_iterator<RandomAccessIterator, Compare> &) const [RandomAccessIterator = __gnu_cxx::__normal_iterator<boost::iterator_range<int *> *, std::vector<boost::iterator_range<int *>>>, Compare = std::less<void>]"
                 );
  }
  piVar2 = (this->m_end)._M_current;
  if ((long)piVar2 - (long)piVar1 == (long)(that->m_end)._M_current - (long)piVar6) {
    bVar8 = piVar1 == piVar2;
    if (!bVar8) {
      __s1 = (piVar1->
             super_iterator_range_base<int_*,_boost::iterators::random_access_traversal_tag>).
             super_iterator_range_base<int_*,_boost::iterators::bidirectional_traversal_tag>.
             super_iterator_range_base<int_*,_boost::iterators::incrementable_traversal_tag>.m_Begin
      ;
      piVar5 = (piVar1->
               super_iterator_range_base<int_*,_boost::iterators::random_access_traversal_tag>).
               super_iterator_range_base<int_*,_boost::iterators::bidirectional_traversal_tag>.
               super_iterator_range_base<int_*,_boost::iterators::incrementable_traversal_tag>.m_End
      ;
      __s2 = (piVar6->
             super_iterator_range_base<int_*,_boost::iterators::random_access_traversal_tag>).
             super_iterator_range_base<int_*,_boost::iterators::bidirectional_traversal_tag>.
             super_iterator_range_base<int_*,_boost::iterators::incrementable_traversal_tag>.m_Begin
      ;
      __n = (long)piVar5 - (long)__s1;
      if (__n == (long)(piVar6->
                       super_iterator_range_base<int_*,_boost::iterators::random_access_traversal_tag>
                       ).
                       super_iterator_range_base<int_*,_boost::iterators::bidirectional_traversal_tag>
                       .
                       super_iterator_range_base<int_*,_boost::iterators::incrementable_traversal_tag>
                       .m_End - (long)__s2) {
        ppiVar7 = &piVar6[1].
                   super_iterator_range_base<int_*,_boost::iterators::random_access_traversal_tag>.
                   super_iterator_range_base<int_*,_boost::iterators::bidirectional_traversal_tag>.
                   super_iterator_range_base<int_*,_boost::iterators::incrementable_traversal_tag>.
                   m_End;
        do {
          piVar6 = piVar1 + 1;
          if ((piVar5 != __s1) && (iVar4 = bcmp(__s1,__s2,__n), iVar4 != 0)) {
            return bVar8;
          }
          bVar8 = piVar6 == piVar2;
          if (bVar8) {
            return bVar8;
          }
          __s1 = (piVar6->
                 super_iterator_range_base<int_*,_boost::iterators::random_access_traversal_tag>).
                 super_iterator_range_base<int_*,_boost::iterators::bidirectional_traversal_tag>.
                 super_iterator_range_base<int_*,_boost::iterators::incrementable_traversal_tag>.
                 m_Begin;
          piVar5 = piVar1[1].
                   super_iterator_range_base<int_*,_boost::iterators::random_access_traversal_tag>.
                   super_iterator_range_base<int_*,_boost::iterators::bidirectional_traversal_tag>.
                   super_iterator_range_base<int_*,_boost::iterators::incrementable_traversal_tag>.
                   m_End;
          __s2 = ((iterator_range_base<int_*,_boost::iterators::incrementable_traversal_tag> *)
                 (ppiVar7 + -1))->m_Begin;
          piVar3 = *ppiVar7;
          __n = (long)piVar5 - (long)__s1;
          ppiVar7 = ppiVar7 + 2;
          piVar1 = piVar6;
        } while (__n == (long)piVar3 - (long)__s2);
      }
    }
    return bVar8;
  }
  return false;
}

Assistant:

bool equal (const merge_iterator & that) const
        {
            assert(this->m_begin == that.m_begin);
            return std::equal(this->m_begin, this->m_end, that.m_begin, that.m_end);
        }